

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void uECC_vli_mult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  char cVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  uECC_word_t *puVar7;
  uECC_word_t r0;
  uECC_word_t r2;
  uECC_word_t r1;
  uECC_word_t local_68;
  uECC_word_t local_60;
  uECC_word_t local_58;
  int local_4c;
  long local_48;
  uECC_word_t *local_40;
  long local_38;
  
  local_68 = 0;
  local_58 = 0;
  uVar1 = (uint)CONCAT71(in_register_00000009,num_words);
  uVar2 = uVar1;
  if (num_words < '\x01') {
    uVar2 = 0;
  }
  local_48 = (long)(int)uVar2;
  local_40 = result;
  for (lVar4 = 0; local_60 = 0, lVar4 != local_48; lVar4 = lVar4 + 1) {
    cVar5 = '\0';
    while( true ) {
      lVar6 = (long)cVar5;
      if (lVar4 < lVar6) break;
      muladd(left[lVar6],right[lVar4 - lVar6],&local_68,&local_58,&local_60);
      cVar5 = cVar5 + '\x01';
    }
    local_40[lVar4] = local_68;
    local_68 = local_58;
    local_58 = local_60;
  }
  local_4c = num_words * 2 + -1;
  cVar5 = '\x01';
  while (local_60 = 0, cVar3 = (char)uVar1, cVar3 < local_4c) {
    local_38 = (long)cVar3;
    local_48 = CONCAT71(local_48._1_7_,cVar5);
    lVar4 = (long)cVar5;
    puVar7 = right + (local_38 - lVar4);
    for (; lVar4 < num_words; lVar4 = lVar4 + 1) {
      muladd(left[lVar4],*puVar7,&local_68,&local_58,&local_60);
      puVar7 = puVar7 + -1;
    }
    local_40[local_38] = local_68;
    local_68 = local_58;
    local_58 = local_60;
    cVar5 = (char)local_48 + '\x01';
    uVar1 = (uint)(byte)(cVar3 + 1);
  }
  local_40[local_4c] = local_68;
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_mult(uECC_word_t *result,
                                const uECC_word_t *left,
                                const uECC_word_t *right,
                                wordcount_t num_words) {
    uECC_word_t r0 = 0;
    uECC_word_t r1 = 0;
    uECC_word_t r2 = 0;
    wordcount_t i, k;

    /* Compute each digit of result in sequence, maintaining the carries. */
    for (k = 0; k < num_words; ++k) {
        for (i = 0; i <= k; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    for (k = num_words; k < num_words * 2 - 1; ++k) {
        for (i = (k + 1) - num_words; i < num_words; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    result[num_words * 2 - 1] = r0;
}